

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECCurveTest_GPlusMinusG_Test::TestBody
          (ECCurveTest_GPlusMinusG_Test *this)

{
  int iVar1;
  EC_POINT *src;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  UniquePtr<EC_POINT> sum;
  AssertHelper local_58;
  string local_50;
  AssertionResult gtest_ar_;
  UniquePtr<EC_POINT> p;
  
  src = EC_GROUP_get0_generator((EC_GROUP *)(this->super_ECCurveTest).group_);
  p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
       EC_POINT_dup(src,(EC_GROUP *)(this->super_ECCurveTest).group_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ec_point_st_*,_bssl::internal::Deleter>)
       p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
  if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
      p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&sum);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,(AssertionResult *)0x4c5fec,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x3b3,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&sum);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = EC_POINT_invert((EC_GROUP *)(this->super_ECCurveTest).group_,
                            (EC_POINT *)
                            p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      sum._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
           EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (tuple<ec_point_st_*,_bssl::internal::Deleter>)
           sum._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
      if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
          sum._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,(internal *)&gtest_ar_,(AssertionResult *)"sum","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x3b7,local_50._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
LAB_002a3c09:
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        std::__cxx11::string::~string((string *)&local_50);
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                             (EC_POINT *)
                             sum._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,src,
                             (EC_POINT *)
                             p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                             .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,(BN_CTX *)0x0)
        ;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_POINT_add(group(), sum.get(), g, p.get(), nullptr)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x3b8,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
          goto LAB_002a3c09;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = EC_POINT_is_at_infinity
                          ((EC_GROUP *)(this->super_ECCurveTest).group_,
                           (EC_POINT *)
                           sum._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_POINT_is_at_infinity(group(), sum.get())","false","true"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x3b9,local_50._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
          goto LAB_002a3c09;
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&sum);
      goto LAB_002a3c3e;
    }
    testing::Message::Message((Message *)&sum);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,
               (AssertionResult *)"EC_POINT_invert(group(), p.get(), nullptr)","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x3b4,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&sum);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
      sum._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)sum._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_002a3c3e:
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&p);
  return;
}

Assistant:

TEST_P(ECCurveTest, GPlusMinusG) {
  const EC_POINT *g = EC_GROUP_get0_generator(group());

  bssl::UniquePtr<EC_POINT> p(EC_POINT_dup(g, group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_invert(group(), p.get(), nullptr));

  bssl::UniquePtr<EC_POINT> sum(EC_POINT_new(group()));
  ASSERT_TRUE(sum);
  ASSERT_TRUE(EC_POINT_add(group(), sum.get(), g, p.get(), nullptr));
  EXPECT_TRUE(EC_POINT_is_at_infinity(group(), sum.get()));
}